

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_game.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_game::load(xr_level_game *this,xr_reader *r)

{
  xr_reader *pxVar1;
  uint32_t uVar2;
  xr_reader *s;
  way_path_io local_51;
  xr_reader *local_50;
  xr_reader *local_48;
  way_path *local_40;
  xr_reader *local_38;
  
  pxVar1 = xr_reader::open_chunk(r,0x1000);
  local_48 = pxVar1;
  local_38 = r;
  if (pxVar1 != (xr_reader *)0x0) {
    local_50 = xr_reader::open_chunk(pxVar1,0);
    if (local_50 != (xr_reader *)0x0) {
      uVar2 = 1;
      do {
        local_40 = (way_path *)0x0;
        std::vector<xray_re::way_path*,std::allocator<xray_re::way_path*>>::
        emplace_back<xray_re::way_path*>
                  ((vector<xray_re::way_path*,std::allocator<xray_re::way_path*>> *)&this->m_paths,
                   &local_40);
        way_path_io::operator()
                  (&local_51,
                   (this->m_paths).
                   super__Vector_base<xray_re::way_path_*,_std::allocator<xray_re::way_path_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1,local_50);
        xr_reader::close_chunk(pxVar1,&local_50);
        local_50 = xr_reader::open_chunk(pxVar1,uVar2);
        uVar2 = uVar2 + 1;
      } while (local_50 != (xr_reader *)0x0);
    }
    r = local_38;
    xr_reader::close_chunk(local_38,&local_48);
  }
  pxVar1 = xr_reader::open_chunk(r,0x2000);
  if (pxVar1 != (xr_reader *)0x0) {
    local_48 = pxVar1;
    local_50 = xr_reader::open_chunk(pxVar1,0);
    if (local_50 != (xr_reader *)0x0) {
      uVar2 = 1;
      do {
        local_40 = (way_path *)0x0;
        std::vector<xray_re::mp_rpoint*,std::allocator<xray_re::mp_rpoint*>>::
        emplace_back<xray_re::mp_rpoint*>
                  ((vector<xray_re::mp_rpoint*,std::allocator<xray_re::mp_rpoint*>> *)
                   &this->m_rpoints,(mp_rpoint **)&local_40);
        mp_rpoint_io::operator()
                  ((mp_rpoint_io *)&local_51,
                   (this->m_rpoints).
                   super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1,local_50);
        xr_reader::close_chunk(pxVar1,&local_50);
        local_50 = xr_reader::open_chunk(pxVar1,uVar2);
        uVar2 = uVar2 + 1;
      } while (local_50 != (xr_reader *)0x0);
    }
    xr_reader::close_chunk(local_38,&local_48);
  }
  return;
}

Assistant:

void xr_level_game::load(xr_reader& r)
{
	xr_reader* s = r.open_chunk(GAME_CHUNK_WAYS);
	if (s) {
		s->r_chunks(m_paths, way_path_io());
		r.close_chunk(s);
	}
	s = r.open_chunk(GAME_CHUNK_RPOINTS);
	if (s) {
		s->r_chunks(m_rpoints, mp_rpoint_io());
		r.close_chunk(s);
	}
}